

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void opj_mqc_bypass_flush_enc(opj_mqc_t *mqc,OPJ_BOOL erterm)

{
  uint uVar1;
  OPJ_BYTE *pOVar2;
  uint uVar3;
  
  uVar3 = mqc->ct;
  if (uVar3 < 7) {
LAB_0011f267:
    uVar1 = 0;
    while (uVar3 = uVar3 - 1, uVar3 != 0xffffffff) {
      mqc->ct = uVar3;
      mqc->c = mqc->c + (uVar1 << ((byte)uVar3 & 0x1f));
      uVar1 = uVar1 ^ 1;
    }
    *mqc->bp = (OPJ_BYTE)mqc->c;
    pOVar2 = mqc->bp + 1;
  }
  else if (uVar3 == 7) {
    if ((erterm != 0) || (mqc->bp[-1] != 0xff)) goto LAB_0011f267;
    pOVar2 = mqc->bp + -1;
  }
  else {
    pOVar2 = mqc->bp;
    if (((erterm != 0 || uVar3 != 8) || (pOVar2[-1] != '\x7f')) || (pOVar2[-2] != 0xff))
    goto LAB_0011f293;
    pOVar2 = pOVar2 + -2;
  }
  mqc->bp = pOVar2;
LAB_0011f293:
  if (pOVar2[-1] != 0xff) {
    return;
  }
  __assert_fail("mqc->bp[-1] != 0xff",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/mqc.c"
                ,0x19c,"void opj_mqc_bypass_flush_enc(opj_mqc_t *, OPJ_BOOL)");
}

Assistant:

void opj_mqc_bypass_flush_enc(opj_mqc_t *mqc, OPJ_BOOL erterm)
{
    /* Is there any bit remaining to be flushed ? */
    /* If the last output byte is 0xff, we can discard it, unless */
    /* erterm is required (I'm not completely sure why in erterm */
    /* we must output 0xff 0x2a if the last byte was 0xff instead of */
    /* discarding it, but Kakadu requires it when decoding */
    /* in -fussy mode) */
    if (mqc->ct < 7 || (mqc->ct == 7 && (erterm || mqc->bp[-1] != 0xff))) {
        OPJ_BYTE bit_value = 0;
        /* If so, fill the remaining lsbs with an alternating sequence of */
        /* 0,1,... */
        /* Note: it seems the standard only requires that for a ERTERM flush */
        /* and doesn't specify what to do for a regular BYPASS flush */
        while (mqc->ct > 0) {
            mqc->ct--;
            mqc->c += (OPJ_UINT32)(bit_value << mqc->ct);
            bit_value = (OPJ_BYTE)(1U - bit_value);
        }
        *mqc->bp = (OPJ_BYTE)mqc->c;
        /* Advance pointer so that opj_mqc_numbytes() returns a valid value */
        mqc->bp++;
    } else if (mqc->ct == 7 && mqc->bp[-1] == 0xff) {
        /* Discard last 0xff */
        assert(!erterm);
        mqc->bp --;
    } else if (mqc->ct == 8 && !erterm &&
               mqc->bp[-1] == 0x7f && mqc->bp[-2] == 0xff) {
        /* Tiny optimization: discard terminating 0xff 0x7f since it is */
        /* interpreted as 0xff 0x7f [0xff 0xff] by the decoder, and given */
        /* the bit stuffing, in fact as 0xff 0xff [0xff ..] */
        /* Happens once on opj_compress -i ../MAPA.tif -o MAPA.j2k  -M 1 */
        mqc->bp -= 2;
    }

    assert(mqc->bp[-1] != 0xff);
}